

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O3

char * Rml::XMLParseTools::FindTag(char *tag,char *string,bool closing_tag)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  char *p_begin;
  StringView local_50;
  StringView local_40;
  
  sVar5 = strlen(tag);
  cVar2 = *string;
  if (cVar2 != '\0') {
    bVar8 = 0;
    p_begin = string;
    do {
      iVar4 = tolower((int)cVar2);
      if (iVar4 == *tag) {
        StringView::StringView(&local_40,p_begin,p_begin + sVar5);
        StringView::StringView(&local_50,tag,tag + sVar5);
        bVar3 = StringUtilities::StringCompareCaseInsensitive(local_40,local_50);
        if (bVar3) {
          pbVar6 = (byte *)(p_begin + -1);
          pbVar7 = pbVar6;
          for (; string < pbVar6; pbVar6 = pbVar6 + -1) {
            bVar1 = *pbVar6;
            pbVar7 = pbVar6;
            if ((0x2f < (ulong)bVar1) || ((0x800100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
            break;
            bVar8 = bVar8 | bVar1 == 0x2f;
            pbVar7 = (byte *)string;
          }
          if ((*pbVar7 == 0x3c) && (((bVar8 ^ closing_tag) & 1) == 0)) {
            return (char *)pbVar7;
          }
        }
      }
      cVar2 = p_begin[1];
      p_begin = p_begin + 1;
    } while (cVar2 != '\0');
  }
  return (char *)0x0;
}

Assistant:

const char* XMLParseTools::FindTag(const char* tag, const char* string, bool closing_tag)
{
	const size_t length = strlen(tag);
	const char* ptr = string;
	bool found_closing = false;

	while (*ptr)
	{
		// Check if the first character matches
		if (tolower((*ptr)) == tag[0])
		{
			// If it does, check the whole word
			if (StringUtilities::StringCompareCaseInsensitive(StringView(ptr, ptr + length), StringView(tag, tag + length)))
			{
				// Check for opening <, loop back in the string skipping white space and forward slashes if
				// we're looking for the closing tag
				const char* tag_start = ptr - 1;
				while (tag_start > string && (StringUtilities::IsWhitespace(*tag_start) || *tag_start == '/'))
				{
					if (*tag_start == '/')
						found_closing = true;
					tag_start--;
				}

				// If the character we're looking at is a <, and found closing matches closing tag,
				// its the tag we're looking for
				if (*tag_start == '<' && found_closing == closing_tag)
					return tag_start;

				// Otherwise, keep looking
			}
		}
		ptr++;
	}

	return nullptr;
}